

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_massage_var(vector_t ***var,float32 fudge_factor,uint32 n_mgau,uint32 n_stream,
                      uint32 n_density,uint32 *veclen)

{
  uint uVar1;
  vector_t *ppfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (n_stream != 0) {
    uVar4 = 0;
    do {
      uVar1 = veclen[uVar4];
      if ((ulong)uVar1 != 0) {
        uVar3 = 0;
        do {
          if (n_mgau != 0) {
            uVar6 = 0;
            do {
              if (n_density != 0) {
                ppfVar2 = var[uVar6][uVar4];
                uVar5 = 0;
                do {
                  ppfVar2[uVar5][uVar3] = ppfVar2[uVar5][uVar3] * (float)fudge_factor;
                  uVar5 = uVar5 + 1;
                } while (n_density != uVar5);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != n_mgau);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != n_stream);
  }
  return 0;
}

Assistant:

int
gauden_massage_var(vector_t ***var,
		  float32 fudge_factor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    var[i][j][k][l] *= fudge_factor;
		}
	    }
	}
    }

    return S3_SUCCESS;
}